

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O1

int __thiscall
CSnapshotDelta::CreateDelta(CSnapshotDelta *this,CSnapshot *pFrom,CSnapshot *pTo,void *pDstData)

{
  int iVar1;
  undefined1 *puVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint *puVar7;
  undefined1 *puVar8;
  ushort *puVar9;
  undefined4 uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  CSnapshot *pCVar15;
  uint *puVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  long in_FS_OFFSET;
  bool bVar20;
  int aPastIndecies [1024];
  CItemList Hashlist [256];
  
  puVar2 = &stack0xffffffffffffffd0;
  do {
    puVar8 = puVar2;
    *(undefined8 *)(puVar8 + -0x1000) = 0;
    puVar2 = puVar8 + -0x1000;
  } while ((int *)(puVar8 + -0x1000) != aPastIndecies + 0x102);
  *(CSnapshotDelta **)(puVar8 + -0x1418) = this;
  *(undefined8 *)(puVar8 + 0x1fff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  puVar7 = (uint *)((long)pDstData + 0xc);
  *(undefined8 *)pDstData = 0;
  *(undefined4 *)((long)pDstData + 8) = 0;
  *(undefined8 *)(puVar8 + -0x1450) = 0x13e678;
  GenerateHash((CItemList *)(puVar8 + -0x408),pTo);
  uVar5 = (ulong)(uint)pFrom->m_NumItems;
  if (0 < pFrom->m_NumItems) {
    lVar4 = 0;
    do {
      uVar3 = *(uint *)((long)&(pFrom + 1)[(int)uVar5].m_DataSize +
                       (long)(&pFrom[1].m_DataSize)[(int)uVar5 + lVar4]);
      uVar11 = uVar3 & 0xf | uVar3 >> 0xc & 0xf0;
      lVar17 = (ulong)(uVar11 << 9) + (ulong)uVar11 * 4;
      if (0 < (long)*(int *)(puVar8 + lVar17 + -0x408)) {
        lVar14 = 0;
        do {
          if (*(uint *)(puVar8 + lVar14 * 4 + (ulong)(uVar11 << 9) + (ulong)uVar11 * 4 + -0x404) ==
              uVar3) {
            if (*(int *)(puVar8 + lVar14 * 4 + lVar17 + -0x304) != -1) goto LAB_0013e714;
            break;
          }
          lVar14 = lVar14 + 1;
        } while (*(int *)(puVar8 + lVar17 + -0x408) != lVar14);
      }
      *(int *)pDstData = *pDstData + 1;
      *puVar7 = uVar3;
      puVar7 = puVar7 + 1;
LAB_0013e714:
      lVar4 = lVar4 + 1;
      uVar5 = (ulong)pFrom->m_NumItems;
    } while (lVar4 < (long)uVar5);
  }
  *(CSnapshot **)(puVar8 + -0x1438) = pFrom;
  *(undefined8 *)(puVar8 + -0x1450) = 0x13e739;
  GenerateHash((CItemList *)(puVar8 + -0x408),pFrom);
  iVar13 = pTo->m_NumItems;
  uVar5 = (ulong)iVar13;
  if (0 < (long)uVar5) {
    uVar6 = 0;
    do {
      uVar3 = *(uint *)((long)&(pTo + 1)[uVar5].m_DataSize +
                       (long)(&pTo[1].m_DataSize)[uVar5 + uVar6]);
      uVar11 = uVar3 & 0xf | uVar3 >> 0xc & 0xf0;
      lVar4 = (ulong)(uVar11 << 9) + (ulong)uVar11 * 4;
      uVar10 = 0xffffffff;
      if (0 < (long)*(int *)(puVar8 + lVar4 + -0x408)) {
        lVar17 = 0;
        do {
          if (*(uint *)(puVar8 + lVar17 * 4 + (ulong)(uVar11 << 9) + (ulong)uVar11 * 4 + -0x404) ==
              uVar3) {
            uVar10 = *(undefined4 *)(puVar8 + lVar17 * 4 + lVar4 + -0x304);
            break;
          }
          lVar17 = lVar17 + 1;
        } while (*(int *)(puVar8 + lVar4 + -0x408) != lVar17);
      }
      *(undefined4 *)(puVar8 + uVar6 * 4 + -0x1408) = uVar10;
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  if (0 < iVar13) {
    *(CSnapshot **)(puVar8 + -0x1410) = pTo + 1;
    *(long *)(puVar8 + -0x1420) = *(long *)(puVar8 + -0x1438) + 8;
    *(int **)(puVar8 + -0x1428) = &pTo[1].m_NumItems;
    *(long *)(puVar8 + -0x1430) = *(long *)(puVar8 + -0x1438) + 0xc;
    uVar6 = 0;
    *(CSnapshot **)(puVar8 + -0x1440) = pTo;
    do {
      lVar14 = (long)pTo->m_NumItems;
      lVar4 = *(long *)(puVar8 + -0x1410) + lVar14 * 4;
      pCVar15 = (CSnapshot *)(lVar4 + 4 + uVar6 * 4);
      lVar17 = lVar4 + lVar14 * 4;
      lVar12 = (long)pCVar15[-1].m_NumItems;
      if (uVar6 == pTo->m_NumItems - 1) {
        pCVar15 = pTo;
      }
      uVar3 = (uint)*(short *)(lVar12 + 2 + lVar17);
      bVar20 = true;
      if ((int)uVar3 < 0x40) {
        bVar20 = *(short *)(*(long *)(puVar8 + -0x1418) + (long)(int)uVar3 * 2) == 0;
      }
      iVar13 = pCVar15->m_DataSize - *(int *)(lVar4 + uVar6 * 4);
      uVar11 = iVar13 - 4;
      puVar9 = (ushort *)(lVar17 + lVar12);
      if (*(int *)(puVar8 + uVar6 * 4 + -0x1408) == -1) {
        *puVar7 = uVar3;
        puVar7[1] = (uint)*puVar9;
        if (bVar20) {
          uVar3 = iVar13 - 1;
          if (-1 < (int)uVar11) {
            uVar3 = uVar11;
          }
          puVar7[2] = (int)uVar3 >> 2;
          puVar7 = puVar7 + 3;
        }
        else {
          puVar7 = puVar7 + 2;
        }
        *(undefined8 *)(puVar8 + -0x1450) = 0x13e948;
        mem_copy(puVar7,puVar9 + 2,uVar11);
        uVar3 = iVar13 - 1;
        if (-1 < (int)uVar11) {
          uVar3 = uVar11;
        }
        uVar3 = (int)uVar3 >> 2;
LAB_0013e953:
        puVar7 = puVar7 + (int)uVar3;
        *(int *)((long)pDstData + 4) = *(int *)((long)pDstData + 4) + 1;
      }
      else {
        uVar3 = iVar13 - 1;
        if (-1 < (int)uVar11) {
          uVar3 = uVar11;
        }
        if (6 < iVar13 - 1U) {
          uVar3 = (int)uVar3 >> 2;
          puVar16 = puVar7 + 3;
          if (!bVar20) {
            puVar16 = puVar7 + 2;
          }
          iVar13 = *(int *)(*(long *)(puVar8 + -0x1438) + 4);
          iVar1 = *(int *)(*(long *)(puVar8 + -0x1420) + (long)iVar13 * 4 +
                          (long)*(int *)(puVar8 + uVar6 * 4 + -0x1408) * 4);
          lVar4 = *(long *)(puVar8 + -0x1428);
          lVar17 = *(long *)(puVar8 + -0x1430);
          lVar18 = 0;
          uVar11 = 0;
          do {
            uVar19 = *(int *)(lVar12 + lVar14 * 8 + lVar4 + lVar18 * 4) -
                     *(int *)((long)iVar13 * 8 + (long)iVar1 + lVar17 + lVar18 * 4);
            puVar16[lVar18] = uVar19;
            uVar11 = uVar11 | uVar19;
            lVar18 = lVar18 + 1;
          } while (uVar3 != (uint)lVar18);
          if (uVar11 != 0) {
            *puVar7 = (int)(short)puVar9[1];
            puVar7[1] = (uint)*puVar9;
            lVar4 = 8;
            if (bVar20) {
              puVar7[2] = uVar3;
              lVar4 = 0xc;
            }
            puVar7 = (uint *)((long)puVar7 + lVar4);
            pTo = *(CSnapshot **)(puVar8 + -0x1440);
            goto LAB_0013e953;
          }
          pTo = *(CSnapshot **)(puVar8 + -0x1440);
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  if (((*pDstData == 0) && (*(int *)((long)pDstData + 4) == 0)) &&
     (*(int *)((long)pDstData + 8) == 0)) {
    iVar13 = 0;
  }
  else {
    iVar13 = (int)puVar7 - (int)pDstData;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(puVar8 + 0x1fff8)) {
    return iVar13;
  }
  *(code **)(puVar8 + -0x1450) = GenerateHash;
  __stack_chk_fail();
}

Assistant:

int CSnapshotDelta::CreateDelta(const CSnapshot *pFrom, CSnapshot *pTo, void *pDstData)
{
	CData *pDelta = (CData *)pDstData;
	int *pData = (int *)pDelta->m_pData;
	int i, ItemSize, PastIndex;
	const CSnapshotItem *pFromItem;
	const CSnapshotItem *pCurItem;
	const CSnapshotItem *pPastItem;
	int SizeCount = 0;

	pDelta->m_NumDeletedItems = 0;
	pDelta->m_NumUpdateItems = 0;
	pDelta->m_NumTempItems = 0;

	CItemList Hashlist[HASHLIST_SIZE];
	GenerateHash(Hashlist, pTo);

	// pack deleted stuff
	for(i = 0; i < pFrom->NumItems(); i++)
	{
		pFromItem = pFrom->GetItem(i);
		if(GetItemIndexHashed(pFromItem->Key(), Hashlist) == -1)
		{
			// deleted
			pDelta->m_NumDeletedItems++;
			*pData = pFromItem->Key();
			pData++;
		}
	}

	GenerateHash(Hashlist, pFrom);
	int aPastIndecies[1024];

	// fetch previous indices
	// we do this as a separate pass because it helps the cache
	const int NumItems = pTo->NumItems();
	for(i = 0; i < NumItems; i++)
	{
		pCurItem = pTo->GetItem(i); // O(1) .. O(n)
		aPastIndecies[i] = GetItemIndexHashed(pCurItem->Key(), Hashlist); // O(n) .. O(n^n)
	}

	for(i = 0; i < NumItems; i++)
	{
		// do delta
		ItemSize = pTo->GetItemSize(i); // O(1) .. O(n)
		pCurItem = pTo->GetItem(i); // O(1) .. O(n)
		PastIndex = aPastIndecies[i];

		bool IncludeSize = pCurItem->Type() >= MAX_NETOBJSIZES || !m_aItemSizes[pCurItem->Type()];

		if(PastIndex != -1)
		{
			int *pItemDataDst = pData+3;

			pPastItem = pFrom->GetItem(PastIndex);

			if(!IncludeSize)
				pItemDataDst = pData+2;

			if(DiffItem(pPastItem->Data(), (int*)pCurItem->Data(), pItemDataDst, ItemSize/4))
			{

				*pData++ = pCurItem->Type();
				*pData++ = pCurItem->ID();
				if(IncludeSize)
					*pData++ = ItemSize/4;
				pData += ItemSize/4;
				pDelta->m_NumUpdateItems++;
			}
		}
		else
		{
			*pData++ = pCurItem->Type();
			*pData++ = pCurItem->ID();
			if(IncludeSize)
				*pData++ = ItemSize/4;

			mem_copy(pData, pCurItem->Data(), ItemSize);
			SizeCount += ItemSize;
			pData += ItemSize/4;
			pDelta->m_NumUpdateItems++;
		}
	}

	if(0)
	{
		dbg_msg("snapshot", "%d %d %d",
			pDelta->m_NumDeletedItems,
			pDelta->m_NumUpdateItems,
			pDelta->m_NumTempItems);
	}

	/*
	// TODO: pack temp stuff

	// finish
	//mem_copy(pDelta->offsets, deleted, pDelta->num_deleted_items*sizeof(int));
	//mem_copy(&(pDelta->offsets[pDelta->num_deleted_items]), update, pDelta->num_update_items*sizeof(int));
	//mem_copy(&(pDelta->offsets[pDelta->num_deleted_items+pDelta->num_update_items]), temp, pDelta->num_temp_items*sizeof(int));
	//mem_copy(pDelta->data_start(), data, data_size);
	//pDelta->data_size = data_size;
	* */

	if(!pDelta->m_NumDeletedItems && !pDelta->m_NumUpdateItems && !pDelta->m_NumTempItems)
		return 0;

	return (int)((char*)pData-(char*)pDstData);
}